

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::c_formatter<spdlog::details::scoped_padder>::format
          (c_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  char *buf_ptr;
  char *pcVar9;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_01;
  scoped_padder p;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char acStack_63 [3];
  char *local_60;
  scoped_padder local_50;
  
  scoped_padder::scoped_padder(&local_50,0x18,&(this->super_flag_formatter).padinfo_,dest);
  pcVar6 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar5 = strlen(pcVar6);
  fmt::v6::internal::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar6,pcVar6 + sVar5);
  sVar7 = (dest->super_buffer<char>).size_;
  uVar8 = sVar7 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar8;
  (dest->super_buffer<char>).ptr_[sVar7] = ' ';
  pcVar6 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar5 = strlen(pcVar6);
  fmt::v6::internal::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar6,pcVar6 + sVar5);
  sVar7 = (dest->super_buffer<char>).size_;
  uVar8 = sVar7 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar8;
  (dest->super_buffer<char>).ptr_[sVar7] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  pcVar6 = fmt::v6::format_int::format_decimal((format_int *)&stack0xffffffffffffff88,(ulong)uVar3);
  local_60 = pcVar6;
  if ((int)uVar1 < 0) {
    local_60 = pcVar6 + -1;
    pcVar6[-1] = '-';
  }
  if (-0x16 < (long)(&stack0xffffffffffffff88 + -(long)local_60)) {
    fmt::v6::internal::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_60,
               local_60 + (long)(&stack0xffffffffffffff88 + -(long)local_60 + 0x15));
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar7] = ' ';
    uVar1 = tm_time->tm_hour;
    pcVar6 = (char *)(ulong)uVar1;
    if (pcVar6 < (char *)0x64) {
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      pcVar6 = in_stack_ffffffffffffff88;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
        pcVar6 = in_stack_ffffffffffffff88;
      }
      bVar4 = (byte)((uVar1 & 0xff) / 10);
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = bVar4 | 0x30;
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = (char)uVar1 + bVar4 * -10 | 0x30;
    }
    else {
      format_str.size_ = 5;
      format_str.data_ = "{:02}";
      args.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&stack0xffffffffffffff88;
      args.types_ = 2;
      fmt::v6::
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)dest,format_str,args,(locale_ref)0x0);
    }
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar7] = ':';
    uVar1 = tm_time->tm_min;
    pcVar9 = (char *)(ulong)uVar1;
    if (pcVar9 < (char *)0x64) {
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      pcVar9 = pcVar6;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
        pcVar9 = pcVar6;
      }
      bVar4 = (byte)((uVar1 & 0xff) / 10);
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = bVar4 | 0x30;
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = (char)uVar1 + bVar4 * -10 | 0x30;
    }
    else {
      format_str_00.size_ = 5;
      format_str_00.data_ = "{:02}";
      args_00.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&stack0xffffffffffffff88;
      args_00.types_ = 2;
      fmt::v6::
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)dest,format_str_00,args_00,(locale_ref)0x0);
    }
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar7] = ':';
    uVar1 = tm_time->tm_sec;
    in_stack_ffffffffffffff88 = (char *)(ulong)uVar1;
    if (in_stack_ffffffffffffff88 < (char *)0x64) {
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      in_stack_ffffffffffffff88 = pcVar9;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
        in_stack_ffffffffffffff88 = pcVar9;
      }
      bVar4 = (byte)((uVar1 & 0xff) / 10);
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = bVar4 | 0x30;
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = (char)uVar1 + bVar4 * -10 | 0x30;
    }
    else {
      format_str_01.size_ = 5;
      format_str_01.data_ = "{:02}";
      args_01.field_1.values_ =
           (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
            *)&stack0xffffffffffffff88;
      args_01.types_ = 2;
      fmt::v6::
      vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                ((range)dest,format_str_01,args_01,(locale_ref)0x0);
    }
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar7] = ' ';
    iVar2 = tm_time->tm_year;
    uVar1 = iVar2 + 0x76c;
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    pcVar6 = fmt::v6::format_int::format_decimal
                       ((format_int *)&stack0xffffffffffffff88,(ulong)uVar3);
    local_60 = pcVar6;
    if (iVar2 < -0x76c) {
      local_60 = pcVar6 + -1;
      pcVar6[-1] = '-';
    }
    if (-0x16 < (long)(&stack0xffffffffffffff88 + -(long)local_60)) {
      fmt::v6::internal::buffer<char>::append<char>
                (&dest->super_buffer<char>,local_60,
                 local_60 + (long)(&stack0xffffffffffffff88 + -(long)local_60 + 0x15));
      scoped_padder::~scoped_padder(&local_50);
      return;
    }
  }
  fmt::v6::internal::assert_fail(in_stack_ffffffffffffff90,0,in_stack_ffffffffffffff88);
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }